

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

Result * __thiscall
testing::internal::
ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
::
Impl<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
::Perform(Result *__return_storage_ptr__,
         Impl<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
         *this,ArgumentTuple *param_1)

{
  element_type *peVar1;
  _Manager_type p_Var2;
  undefined8 uVar3;
  bool bVar4;
  GTestLog local_14;
  
  bVar4 = IsTrue((bool)(this->performed_ ^ 1));
  if (!bVar4) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
                       ,0x2c5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !performed_ failed. ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"A ByMove() action should only be performed once.",0x30);
    GTestLog::~GTestLog(&local_14);
  }
  this->performed_ = true;
  peVar1 = (this->wrapper_).
           super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  *(undefined8 *)
   &(__return_storage_ptr__->_M_t).
    super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
    super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->_M_t).
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false>._M_head_impl + 8) = 0;
  *(_Manager_type *)
   ((long)&(__return_storage_ptr__->_M_t).
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false>._M_head_impl + 0x10) =
       (_Manager_type)0x0;
  *(_Invoker_type *)
   ((long)&(__return_storage_ptr__->_M_t).
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false>._M_head_impl + 0x18) =
       *(_Invoker_type *)
        ((long)&(peVar1->payload)._M_t.
                super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
                super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_> + 0x18);
  p_Var2 = *(_Manager_type *)
            ((long)&(peVar1->payload)._M_t.
                    super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
                    super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_> + 0x10
            );
  if (p_Var2 != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)
             ((long)&(peVar1->payload)._M_t.
                     super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
                     super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_> + 8);
    *(undefined8 *)
     &(__return_storage_ptr__->_M_t).
      super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
      super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
      super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
      super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false>._M_head_impl =
         *(undefined8 *)
          &(peVar1->payload)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_M_t).
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false>._M_head_impl + 8) =
         uVar3;
    *(_Manager_type *)
     ((long)&(__return_storage_ptr__->_M_t).
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false>._M_head_impl + 0x10) =
         p_Var2;
    *(_Manager_type *)
     ((long)&(peVar1->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_> + 0x10) =
         (_Manager_type)0x0;
    *(_Invoker_type *)
     ((long)&(peVar1->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_> + 0x18) =
         (_Invoker_type)0x0;
  }
  (__return_storage_ptr__->_M_t).
  super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
  super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
  super__Head_base<0UL,_SDL_Window_*,_false>._M_head_impl =
       ((_Head_base<0UL,_SDL_Window_*,_false> *)
       ((long)&(peVar1->payload)._M_t.
               super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
               super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_> + 0x20))->
       _M_head_impl;
  ((_Head_base<0UL,_SDL_Window_*,_false> *)
  ((long)&(peVar1->payload)._M_t.
          super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
          super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_> + 0x20))->
  _M_head_impl = (SDL_Window_conflict *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Result Perform(const ArgumentTuple&) override {
      GTEST_CHECK_(!performed_)
          << "A ByMove() action should only be performed once.";
      performed_ = true;
      return std::move(wrapper_->payload);
    }